

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

void __thiscall ParialSphere_Normal_Test::TestBody(ParialSphere_Normal_Test *this)

{
  long lVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  int c_1;
  float *pfVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  uint64_t oldstate;
  ulong uVar12;
  char *message;
  int c;
  int iVar13;
  long lVar14;
  float fVar15;
  Float zMin;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM7 [64];
  undefined1 in_XMM9 [16];
  AssertionResult gtest_ar;
  Bounds3f bbox;
  optional<pbrt::ShapeIntersection> si;
  Sphere sphere;
  Transform identity;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  float local_2ac [4];
  float local_29c;
  float local_298;
  float local_294;
  Ray local_290;
  internal local_268 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  long local_230;
  AssertHelper local_228;
  Bounds3f local_220;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1e8;
  char local_e8;
  Sphere local_e0;
  Transform local_b0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  lVar14 = 0;
  do {
    uVar10 = ((ulong)(lVar14 * 0x7fb5d329728ea185) >> 0x1b ^ lVar14 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    lVar1 = lVar14 * 2 + 1;
    pbrt::Transform::Transform(&local_b0);
    uVar10 = ((uVar10 >> 0x21 ^ uVar10) + 1) * 0x5851f42d4c957f2d + lVar14 * -0x4f5c17a566d501a4 + 1
    ;
    uVar12 = uVar10 * 0x5851f42d4c957f2d + 1 + lVar14 * 2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar10;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar12;
    auVar21 = vpunpcklqdq_avx(auVar26,auVar18);
    auVar16 = vpsrlvq_avx2(auVar21,_DAT_005c85c0);
    auVar18 = vpsrlvq_avx2(auVar21,_DAT_005c85b0);
    auVar16 = vpshufd_avx(auVar18 ^ auVar16,0xe8);
    auVar21 = vpsrlq_avx(auVar21,0x3b);
    auVar21 = vpshufd_avx(auVar21,0xe8);
    auVar16 = vprorvd_avx512vl(auVar16,auVar21);
    auVar21 = vcvtudq2ps_avx512vl(auVar16);
    auVar16._8_4_ = 0x2f800000;
    auVar16._0_8_ = 0x2f8000002f800000;
    auVar16._12_4_ = 0x2f800000;
    local_258 = vmulps_avx512vl(auVar21,auVar16);
    auVar21._8_4_ = 0x3f7fffff;
    auVar21._0_8_ = 0x3f7fffff3f7fffff;
    auVar21._12_4_ = 0x3f7fffff;
    uVar10 = vcmpps_avx512vl(local_258,auVar21,1);
    local_248._0_2_ = (short)uVar10;
    bVar9 = (byte)(uVar10 >> 1);
    auVar16 = vmovshdup_avx(local_258);
    fVar15 = (float)((uint)(bVar9 & 1) * auVar16._0_4_ + (uint)!(bool)(bVar9 & 1) * 0x3f7fffff);
    auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * 4.0)),ZEXT416((uint)(1.0 - fVar15)),
                              ZEXT416(0xc0800000));
    auVar24._0_8_ = pow(10.0,(double)auVar16._0_4_);
    auVar24._8_56_ = extraout_var_00;
    auVar17._0_4_ = (float)auVar24._0_8_;
    auVar17._4_12_ = auVar24._4_12_;
    uVar10 = uVar12 * 0x5851f42d4c957f2d + 1 + lVar14 * 2;
    auVar16 = in_ZMM7._0_16_;
    if (((local_248 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (0.5 <= (float)local_258._0_4_)) {
      uVar12 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar9 = (byte)(uVar10 >> 0x3b);
      auVar21 = vcvtusi2ss_avx512f(auVar16,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
      auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),
                           SUB6416(ZEXT464(0x3f7fffff),0));
      auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * auVar17._0_4_)),auVar17,
                                 ZEXT416((uint)(1.0 - auVar21._0_4_)));
      zMin = auVar21._0_4_;
    }
    else {
      auVar3._8_4_ = 0x80000000;
      auVar3._0_8_ = 0x8000000080000000;
      auVar3._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(auVar17,auVar3);
      zMin = auVar21._0_4_;
      uVar12 = uVar10;
    }
    uVar10 = uVar12 * 0x5851f42d4c957f2d + lVar1;
    uVar11 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
    bVar9 = (byte)(uVar12 >> 0x3b);
    auVar21 = vcvtusi2ss_avx512f(auVar16,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
    auVar26 = SUB6416(ZEXT464(0x3f7fffff),0);
    auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),auVar26);
    auVar18 = auVar17;
    if (0.5 <= auVar21._0_4_) {
      uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar9 = (byte)(uVar10 >> 0x3b);
      auVar21 = vcvtusi2ss_avx512f(auVar16,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
      auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),auVar26);
      auVar18 = vfnmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * auVar17._0_4_)),auVar17,
                                 ZEXT416((uint)(1.0 - auVar21._0_4_)));
      uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
    }
    uVar12 = uVar10 * 0x5851f42d4c957f2d + lVar1;
    uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar9 = (byte)(uVar10 >> 0x3b);
    auVar21 = vcvtusi2ss_avx512f(auVar16,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
    auVar21 = vminss_avx(ZEXT416((uint)(auVar21._0_4_ * 2.3283064e-10)),auVar26);
    if (0.5 <= auVar21._0_4_) {
      uVar10 = uVar12 * 0x5851f42d4c957f2d + lVar1;
      uVar11 = (uint)(uVar12 >> 0x2d) ^ (uint)(uVar12 >> 0x1b);
      bVar9 = (byte)(uVar12 >> 0x3b);
      auVar16 = vcvtusi2ss_avx512f(auVar16,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
      auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),auVar26);
      fVar15 = auVar16._0_4_ * 360.0;
    }
    else {
      fVar15 = 360.0;
      uVar10 = uVar12;
    }
    iVar13 = 0;
    local_230 = lVar14;
    pbrt::Sphere::Sphere
              (&local_e0,&local_b0,&local_b0,false,auVar17._0_4_,zMin,auVar18._0_4_,fVar15);
    local_298 = 0.0;
    local_29c = 0.0;
    local_2ac[3] = 0.0;
    do {
      uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar9 = (byte)(uVar10 >> 0x3b);
      auVar16 = vcvtusi2ss_avx512f(in_ZMM7._0_16_,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
      auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),
                           SUB6416(ZEXT464(0x3f7fffff),0));
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(auVar16._0_4_ * 8.0)),
                                ZEXT416((uint)(1.0 - auVar16._0_4_)),ZEXT416(0xc1000000));
      dVar20 = pow(10.0,(double)auVar16._0_4_);
      pfVar8 = (float *)((long)local_2ac + 0x14);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          pfVar8 = (float *)((long)local_2ac + 0x10);
        }
        else {
          pfVar8 = (float *)((long)local_2ac + 0xc);
        }
      }
      uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      *pfVar8 = (float)dVar20;
      iVar13 = iVar13 + 1;
    } while (iVar13 != 3);
    pbrt::Sphere::Bounds(&local_220,&local_e0);
    lVar14 = local_230;
    in_ZMM7 = ZEXT464(0x3f7fffff);
    iVar13 = 0;
    local_2ac[2] = 0.0;
    local_2ac[1] = 0.0;
    local_2ac[0] = 0.0;
    do {
      uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar9 = (byte)(uVar10 >> 0x3b);
      auVar16 = vcvtusi2ss_avx512f(in_XMM9,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
      auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),in_ZMM7._0_16_);
      pfVar8 = (float *)((long)local_2ac + 8);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          pfVar8 = (float *)((long)local_2ac + 4);
        }
        else {
          pfVar8 = local_2ac;
        }
      }
      uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      *pfVar8 = auVar16._0_4_;
      iVar13 = iVar13 + 1;
    } while (iVar13 != 3);
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(local_2ac[0] *
                                            local_220.pMax.super_Tuple3<pbrt::Point3,_float>.z)),
                              ZEXT416((uint)(1.0 - local_2ac[0])),
                              ZEXT416((uint)local_220.pMin.super_Tuple3<pbrt::Point3,_float>.z));
    auVar16 = vinsertps_avx(ZEXT416((uint)local_2ac[2]),ZEXT416((uint)local_2ac[1]),0x10);
    auVar32._8_8_ = 0;
    auVar32._0_4_ = local_220.pMin.super_Tuple3<pbrt::Point3,_float>.x;
    auVar32._4_4_ = local_220.pMin.super_Tuple3<pbrt::Point3,_float>.y;
    auVar35._8_4_ = 0x3f800000;
    auVar35._0_8_ = 0x3f8000003f800000;
    auVar35._12_4_ = 0x3f800000;
    auVar21 = vsubps_avx(auVar35,auVar16);
    auVar27._0_4_ = auVar16._0_4_ * local_220.pMax.super_Tuple3<pbrt::Point3,_float>.x;
    auVar27._4_4_ = auVar16._4_4_ * local_220.pMax.super_Tuple3<pbrt::Point3,_float>.y;
    auVar27._8_4_ = auVar16._8_4_ * 0.0;
    auVar27._12_4_ = auVar16._12_4_ * 0.0;
    auVar21 = vfmadd231ps_fma(auVar27,auVar32,auVar21);
    auVar16 = vinsertps_avx(ZEXT416((uint)local_298),ZEXT416((uint)local_29c),0x10);
    auVar16 = vsubps_avx(auVar21,auVar16);
    local_290.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_ - local_2ac[3];
    local_290.o.super_Tuple3<pbrt::Point3,_float>.x = local_298;
    local_290.o.super_Tuple3<pbrt::Point3,_float>.y = local_29c;
    local_290.o.super_Tuple3<pbrt::Point3,_float>.z = local_2ac[3];
    uVar12 = vmovlps_avx(auVar16);
    local_290.time = 0.0;
    local_290.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    uVar11 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
    bVar9 = (byte)(uVar10 >> 0x3b);
    auVar16 = vcvtusi2ss_avx512f(in_XMM9,uVar11 >> bVar9 | uVar11 << 0x20 - bVar9);
    auVar16 = vminss_avx(ZEXT416((uint)(auVar16._0_4_ * 2.3283064e-10)),in_ZMM7._0_16_);
    local_290.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar12;
    if (auVar16._0_4_ < 0.5) {
      local_290.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar12;
      local_290.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(uVar12 >> 0x20);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_290.d.super_Tuple3<pbrt::Vector3,_float>.y *
                                              local_290.d.super_Tuple3<pbrt::Vector3,_float>.y)),
                                ZEXT416((uint)local_290.d.super_Tuple3<pbrt::Vector3,_float>.x),
                                ZEXT416((uint)local_290.d.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)local_290.d.super_Tuple3<pbrt::Vector3,_float>.z),
                                ZEXT416((uint)local_290.d.super_Tuple3<pbrt::Vector3,_float>.z),
                                auVar16);
      if (auVar16._0_4_ < 0.0) {
        fVar15 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar15 = auVar16._0_4_;
      }
      auVar28._8_8_ = 0;
      auVar28._0_4_ = local_290.d.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar28._4_4_ = local_290.d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar30._4_4_ = fVar15;
      auVar30._0_4_ = fVar15;
      auVar30._8_4_ = fVar15;
      auVar30._12_4_ = fVar15;
      auVar16 = vdivps_avx(auVar28,auVar30);
      local_290.d.super_Tuple3<pbrt::Vector3,_float>.z =
           local_290.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar15;
      local_290.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar16);
    }
    pbrt::Sphere::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_1e8.__align,&local_e0,&local_290,INFINITY
              );
    if (local_e8 == '\x01') {
      fVar15 = (float)local_1e8._40_4_ * (float)local_1e8._40_4_ +
               (float)local_1e8._44_4_ * (float)local_1e8._44_4_ +
               (float)local_1e8._48_4_ * (float)local_1e8._48_4_;
      if (fVar15 < 0.0) {
        auVar25._0_4_ = sqrtf(fVar15);
        auVar25._4_60_ = extraout_var;
        auVar16 = auVar25._0_16_;
      }
      else {
        auVar16 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
      }
      if (local_e8 == '\0') {
        pbrt::LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x3089585);
      }
      fVar15 = ((float)local_1e8._0_4_ + (float)local_1e8._4_4_) * 0.5;
      auVar6._4_8_ = local_1e8._12_8_;
      auVar6._0_4_ = local_1e8._8_4_;
      auVar6._12_4_ = local_1e8._20_4_;
      auVar34._4_4_ = local_1e8._48_4_;
      auVar34._0_4_ = local_1e8._44_4_;
      auVar34._8_8_ = 0;
      auVar21 = vinsertps_avx(auVar6,ZEXT416((uint)local_1e8._20_4_),0x10);
      auVar22._0_4_ = (float)local_1e8._12_8_ + auVar21._0_4_;
      auVar22._4_4_ = (float)((ulong)local_1e8._12_8_ >> 0x20) + auVar21._4_4_;
      auVar22._8_4_ = auVar21._8_4_ + 0.0;
      auVar22._12_4_ = auVar21._12_4_ + 0.0;
      auVar4._8_4_ = 0x3f000000;
      auVar4._0_8_ = 0x3f0000003f000000;
      auVar4._12_4_ = 0x3f000000;
      auVar17 = vmulps_avx512vl(auVar22,auVar4);
      auVar21 = vmovshdup_avx(auVar17);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ * auVar17._0_4_)),ZEXT416((uint)fVar15)
                                ,ZEXT416((uint)fVar15));
      auVar21 = vfmadd231ss_fma(auVar18,auVar21,auVar21);
      if (auVar21._0_4_ < 0.0) {
        local_258._0_4_ = fVar15;
        local_294 = (float)local_1e8._40_4_;
        local_248 = auVar16;
        local_208 = auVar17;
        local_1f8 = auVar34;
        fVar19 = sqrtf(auVar21._0_4_);
        uVar2 = local_294;
        fVar15 = (float)local_258._0_4_;
        auVar34 = local_1f8;
        auVar16 = local_248;
        auVar17 = local_208;
      }
      else {
        auVar21 = vsqrtss_avx(auVar21,auVar21);
        fVar19 = auVar21._0_4_;
        uVar2 = local_1e8._40_4_;
      }
      fVar31 = auVar16._0_4_;
      auVar29._4_4_ = fVar31;
      auVar29._0_4_ = fVar31;
      auVar29._8_4_ = fVar31;
      auVar29._12_4_ = fVar31;
      auVar16 = vdivps_avx(auVar34,auVar29);
      auVar23._4_4_ = fVar19;
      auVar23._0_4_ = fVar19;
      auVar23._8_4_ = fVar19;
      auVar23._12_4_ = fVar19;
      auVar21 = vdivps_avx(auVar17,auVar23);
      auVar33._0_4_ = auVar16._0_4_ * auVar21._0_4_;
      auVar33._4_4_ = auVar16._4_4_ * auVar21._4_4_;
      auVar33._8_4_ = auVar16._8_4_ * auVar21._8_4_;
      auVar33._12_4_ = auVar16._12_4_ * auVar21._12_4_;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar18 = vxorps_avx512vl(auVar33,auVar5);
      auVar18 = vpermt2ps_avx512vl(auVar33,_DAT_005ca5c0,auVar18);
      auVar16 = vfmadd231ps_fma(auVar18,auVar16,auVar21);
      auVar16 = vhaddps_avx(auVar16,auVar16);
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)((float)uVar2 / fVar31)),
                                ZEXT416((uint)(fVar15 / fVar19)));
      testing::internal::CmpHelperFloatingPointEQ<float>(local_268,"1.","dot",1.0,auVar16._0_4_);
      if (local_268[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_2b8);
        message = "";
        if (local_260.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_260.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes_test.cpp"
                   ,0x185,message);
        testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_2b8);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        if (local_2b8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar7 = testing::internal::IsTrue(true);
          if ((bVar7) &&
             (local_2b8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_2b8.ptr_ + 8))();
          }
          local_2b8.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_260,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (local_e8 == '\x01') {
      local_e8 = '\0';
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 100);
  return;
}

Assistant:

TEST(ParialSphere, Normal) {
    for (int i = 0; i < 100; ++i) {
        RNG rng(i);
        Transform identity;
        Float radius = pExp(rng, 4);
        Float zMin = rng.Uniform<Float>() < 0.5
                         ? -radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float zMax = rng.Uniform<Float>() < 0.5
                         ? radius
                         : Lerp(rng.Uniform<Float>(), -radius, radius);
        Float phiMax = rng.Uniform<Float>() < 0.5 ? 360. : rng.Uniform<Float>() * 360.;
        Sphere sphere(&identity, &identity, false, radius, zMin, zMax, phiMax);

        // Ray origin
        Point3f o;
        for (int c = 0; c < 3; ++c)
            o[c] = pExp(rng);

        // Destination: a random point in the shape's bounding box.
        Bounds3f bbox = sphere.Bounds();
        Point3f t;
        for (int c = 0; c < 3; ++c)
            t[c] = rng.Uniform<Float>();
        Point3f p2 = bbox.Lerp(t);

        // Ray to intersect with the shape.
        Ray r(o, p2 - o);
        if (rng.Uniform<Float>() < .5)
            r.d = Normalize(r.d);

        // We should usually (but not always) find an intersection.
        auto si = sphere.Intersect(r, Infinity);
        if (!si)
            continue;

        Float dot = Dot(Normalize(si->intr.n), Normalize(Vector3f(si->intr.p())));
        EXPECT_FLOAT_EQ(1., dot);
    }
}